

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.h
# Opt level: O0

void __thiscall r_exec::Pred::~Pred(Pred *this)

{
  Pred *this_local;
  
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
  super__Object._vptr__Object = (_func_int **)&PTR__Pred_002eada8;
  std::vector<core::P<r_exec::Sim>,_std::allocator<core::P<r_exec::Sim>_>_>::~vector
            (&this->simulations);
  std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>::~vector
            (&this->grounds);
  LObject::~LObject(&this->super_LObject);
  return;
}

Assistant:

class REPLICODE_EXPORT Pred:
    public LObject
{
public:
    Pred();
    Pred(r_code::SysObject *source);
    Pred(_Fact *target, double psln_thr);

    bool is_invalidated();
    bool grounds_invalidated(_Fact *evidence);

    _Fact *get_target() const;

    std::vector<P<_Fact> > grounds; // f1->obj; predictions that were used to build this predictions (i.e. antecedents); empty if simulated.
    std::vector<P<Sim> > simulations;

    bool is_simulation() const;
    Sim *get_simulation(Controller *root) const; // return true if there is a simulation for the goal.
}